

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::get
          (ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this,
          ExceptionOrValue *output)

{
  ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *pEVar1;
  ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this_00;
  ExceptionOrValue *output_local;
  ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this_local;
  
  pEVar1 = mv<kj::_::ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>>>
                     (&this->result);
  this_00 = ExceptionOrValue::as<kj::Array<kj::(anonymous_namespace)::SocketAddress>>(output);
  ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::operator=(this_00,pEVar1);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    output.as<T>() = kj::mv(result);
  }